

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

size_type __thiscall wabt::string_view::find(string_view *this,char *s,size_type pos,size_type n)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  
  uVar1 = this->size_;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  pcVar2 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (this->data_ + pos,this->data_ + uVar1,s,s + n);
  sVar3 = 0xffffffffffffffff;
  if (pcVar2 != this->data_ + this->size_) {
    sVar3 = (long)pcVar2 - (long)this->data_;
  }
  return sVar3;
}

Assistant:

string_view::size_type string_view::find(const char* s,
                                         size_type pos,
                                         size_type n) const {
  return find(string_view(s, n), pos);
}